

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

bool __thiscall
FlowGraph::RemoveUnreachableBlock(FlowGraph *this,BasicBlock *block,GlobOpt *globOpt)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *ppFVar5;
  byte bVar6;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  Iterator local_40;
  
  pSVar7 = &(block->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  if (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
       (block->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar7) &&
     (this->func->m_fg->blockList != block)) {
LAB_003fd34e:
    RemoveBlock(this,block,globOpt,false);
    bVar3 = true;
  }
  else {
    if ((block->field_0x18 & 4) != 0) {
      bVar6 = 1;
      local_40.list = pSVar7;
      local_40.current = &pSVar7->super_SListNodeBase<Memory::ArenaAllocator>;
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      while( true ) {
        if (pSVar7 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar3) goto LAB_003fd369;
          *puVar4 = 0;
          pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
        }
        pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                 (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  &pSVar7->super_SListNodeBase<Memory::ArenaAllocator>)->
                 super_SListNodeBase<Memory::ArenaAllocator>).next;
        if (pSVar7 == local_40.list) break;
        local_40.current = (NodeBase *)pSVar7;
        ppFVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            (&local_40);
        pBVar1 = (*ppFVar5)->predBlock;
        if (pBVar1 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x98c,"(pred)","pred");
          if (!bVar3) {
LAB_003fd369:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar4 = 0;
        }
        bVar3 = Loop::IsDescendentOrSelf(block->loop,pBVar1->loop);
        bVar6 = bVar6 & bVar3;
        pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      }
      if (bVar6 != 0) goto LAB_003fd34e;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool
FlowGraph::RemoveUnreachableBlock(BasicBlock *block, GlobOpt * globOpt)
{
    bool isDead = false;

    if ((block->GetPredList() == nullptr || block->GetPredList()->Empty()) && block != this->func->m_fg->blockList)
    {
        isDead = true;
    }
    else if (block->isLoopHeader)
    {
        // A dead loop still has back-edges pointing to it...
        isDead = true;
        FOREACH_PREDECESSOR_BLOCK(pred, block)
        {
            if (!block->loop->IsDescendentOrSelf(pred->loop))
            {
                isDead = false;
            }
        } NEXT_PREDECESSOR_BLOCK;
    }

    if (isDead)
    {
        this->RemoveBlock(block, globOpt);
        return true;
    }
    return false;
}